

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastInlineStringCharCodeAt(Lowerer *this,Instr *instr,BuiltinFunction index)

{
  Opnd *this_00;
  _func_int **pp_Var1;
  Instr *argoutInlineSpecialized;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  LabelInstr *doneLabel;
  LabelInstr *labelHelper;
  Lowerer *this_01;
  Instr *in_R9;
  Opnd *pOStack_58;
  Opnd *argsOpnd [2];
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x524e,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar3) goto LAB_005a9b71;
    *puVar5 = 0;
  }
  this_00 = instr->m_src2;
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) goto LAB_005a9b71;
    *puVar5 = 0;
  }
  pp_Var1 = this_00[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar3) goto LAB_005a9b71;
    *puVar5 = 0;
  }
  argoutInlineSpecialized = (Instr *)pp_Var1[5];
  pOStack_58 = (Opnd *)0x0;
  argsOpnd[0] = (Opnd *)0x0;
  bVar3 = IR::Instr::FetchOperands(instr,&pOStack_58,2);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5257,"(result)","result");
    if (!bVar3) {
LAB_005a9b71:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  doneLabel = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(instr,&doneLabel->super_Instr);
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  bVar3 = GenerateFastCharAt(this,index,instr->m_dst,pOStack_58,argsOpnd[0],in_R9,instr,labelHelper,
                             doneLabel);
  IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
  if (bVar3) {
    this_01 = (Lowerer *)0x9;
    InsertBranch(Br,true,doneLabel,&labelHelper->super_Instr);
    RelocateCallDirectToHelperPath(this_01,argoutInlineSpecialized,labelHelper);
  }
  return bVar3;
}

Assistant:

bool
Lowerer::GenerateFastInlineStringCharCodeAt(IR::Instr * instr, Js::BuiltinFunction index)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

    //CallDirect src2
    IR::Opnd * linkOpnd = instr->GetSrc2();
    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2] = {0};
    bool result  = instr->FetchOperands(argsOpnd, 2);
    Assert(result);

    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr->InsertAfter(doneLabel);

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    bool success = GenerateFastCharAt(index, instr->GetDst(), argsOpnd[0], argsOpnd[1],
            instr, instr, labelHelper, doneLabel);

    instr->InsertBefore(labelHelper);
    if (!success)
    {
        return false;
    }

    InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);

    return true;
}